

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

void __thiscall
LPCMStreamReader::storeChannelData
          (LPCMStreamReader *this,uint8_t *start,uint8_t *end,int chNum,uint8_t *tmpData,int mch)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  uVar1 = 3;
  if (this->m_bitsPerSample != 0x14) {
    uVar1 = (ulong)(this->m_bitsPerSample >> 3);
  }
  for (puVar2 = start + (chNum + -1) * (int)uVar1; puVar2 < end; puVar2 = puVar2 + mch * (int)uVar1)
  {
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      tmpData[uVar3] = puVar2[uVar3];
    }
    tmpData = tmpData + uVar3;
  }
  return;
}

Assistant:

void LPCMStreamReader::storeChannelData(const uint8_t* start, const uint8_t* end, const int chNum, uint8_t* tmpData,
                                        const int mch) const
{
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = mch * ch1SampleSize;
    const int offset = ch1SampleSize * (chNum - 1);
    const uint8_t* curPos = start + offset;
    uint8_t* dst = tmpData;
    for (; curPos < end; curPos += fullSampleSize)
    {
        for (int j = 0; j < ch1SampleSize; j++) *dst++ = curPos[j];
    }
}